

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

int QUtf8::compareUtf8(QByteArrayView utf8,QStringView utf16,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  storage_type_conflict *psVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined7 uVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [15];
  uint5 uVar21;
  undefined1 auVar22 [15];
  unkuint9 Var23;
  undefined1 auVar24 [11];
  undefined1 auVar25 [13];
  undefined1 auVar26 [15];
  undefined1 auVar27 [11];
  undefined1 auVar28 [13];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  uint7 uVar33;
  char32_t ucs4;
  char32_t ucs4_00;
  long lVar34;
  long lVar35;
  sbyte sVar36;
  uint uVar37;
  long lVar38;
  storage_type_conflict *psVar39;
  ushort uVar40;
  uint uVar41;
  byte *pbVar42;
  byte *pbVar43;
  storage_type_conflict *psVar44;
  storage_type_conflict sVar45;
  byte bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  psVar39 = utf16.m_data;
  pbVar42 = (byte *)utf8.m_data;
  pbVar43 = pbVar42 + utf8.m_size;
  psVar1 = psVar39 + utf16.m_size;
  do {
    lVar38 = (long)psVar1 - (long)psVar39 >> 1;
    if ((long)pbVar43 - (long)pbVar42 < lVar38) {
      lVar38 = (long)pbVar43 - (long)pbVar42;
    }
    lVar35 = 0;
    do {
      lVar34 = lVar35;
      if (lVar38 <= lVar34 + 0x10) {
        lVar35 = lVar34;
        if (lVar34 + 8 < lVar38) {
          uVar3 = *(ulong *)(pbVar42 + lVar34);
          psVar44 = psVar39 + lVar34;
          bVar46 = (byte)(uVar3 >> 0x38);
          auVar7._8_6_ = 0;
          auVar7._0_8_ = uVar3;
          auVar7[0xe] = bVar46;
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar3;
          auVar9[0xc] = (char)(uVar3 >> 0x30);
          auVar9._13_2_ = auVar7._13_2_;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar3;
          auVar11._12_3_ = auVar9._12_3_;
          auVar13._8_2_ = 0;
          auVar13._0_8_ = uVar3;
          auVar13[10] = (char)(uVar3 >> 0x28);
          auVar13._11_4_ = auVar11._11_4_;
          auVar15._8_2_ = 0;
          auVar15._0_8_ = uVar3;
          auVar15._10_5_ = auVar13._10_5_;
          auVar17[8] = (char)(uVar3 >> 0x20);
          auVar17._0_8_ = uVar3;
          auVar17._9_6_ = auVar15._9_6_;
          auVar26._7_8_ = 0;
          auVar26._0_7_ = auVar17._8_7_;
          Var23 = CONCAT81(SUB158(auVar26 << 0x40,7),(char)(uVar3 >> 0x18));
          auVar31._9_6_ = 0;
          auVar31._0_9_ = Var23;
          auVar27._1_10_ = SUB1510(auVar31 << 0x30,5);
          auVar27[0] = (char)(uVar3 >> 0x10);
          auVar32._11_4_ = 0;
          auVar32._0_11_ = auVar27;
          auVar19 = SUB1512(auVar32 << 0x20,3);
          auVar28._1_12_ = auVar19;
          auVar28[0] = (char)(uVar3 >> 8);
          sVar45 = CONCAT11(0,(byte)uVar3);
          auVar20._2_13_ = auVar28;
          auVar20._0_2_ = sVar45;
          auVar48._0_2_ = -(ushort)(*psVar44 == sVar45);
          auVar48._2_2_ = -(ushort)(psVar44[1] == auVar28._0_2_);
          auVar48._4_2_ = -(ushort)(psVar44[2] == auVar27._0_2_);
          auVar48._6_2_ = -(ushort)(psVar44[3] == (storage_type_conflict)Var23);
          auVar48._8_2_ = -(ushort)(psVar44[4] == auVar17._8_2_);
          auVar48._10_2_ = -(ushort)(psVar44[5] == auVar13._10_2_);
          auVar48._12_2_ = -(ushort)(psVar44[6] == auVar9._12_2_);
          auVar48._14_2_ = -(ushort)(psVar44[7] == (storage_type_conflict)(auVar7._13_2_ >> 8));
          uVar40 = (ushort)SUB151(auVar20 >> 7,0) | (ushort)SUB131(auVar28 >> 7,0) << 2 |
                   (ushort)SUB121(auVar19 >> 0xf,0) << 4 | (ushort)SUB121(auVar19 >> 0x1f,0) << 6 |
                   (ushort)(SUB121(auVar19 >> 0x2f,0) & 1) << 8 |
                   (ushort)(SUB121(auVar19 >> 0x37,0) & 1) << 9 |
                   (ushort)(SUB121(auVar19 >> 0x3f,0) & 1) << 10 |
                   (ushort)(SUB121(auVar19 >> 0x47,0) & 1) << 0xb |
                   (ushort)(SUB121(auVar19 >> 0x4f,0) & 1) << 0xc |
                   (ushort)(SUB121(auVar19 >> 0x57,0) & 1) << 0xd | (ushort)(bVar46 >> 7) << 0xe |
                   ~((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                     (ushort)((byte)(auVar48._14_2_ >> 7) & 1) << 0xe | auVar48._14_2_ & 0x8000);
          lVar35 = lVar34 + 8;
          if (uVar40 != 0) {
            uVar41 = (uint)uVar40;
            goto LAB_00124893;
          }
        }
        lVar34 = lVar35;
        lVar35 = lVar34;
        if (lVar38 <= lVar34 + 4) goto LAB_001248ab;
        uVar5 = *(undefined4 *)(pbVar42 + lVar34);
        uVar4 = *(undefined8 *)(psVar39 + lVar34);
        bVar46 = (byte)((uint)uVar5 >> 0x18);
        uVar18 = CONCAT25((short)(((uint7)bVar46 << 0x30) >> 0x28),
                          CONCAT14((char)((uint)uVar5 >> 0x10),uVar5));
        uVar33 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar18 >> 0x20),uVar5) >> 0x18),
                                 (char)((uint)uVar5 >> 8)) & 0xffffff00ff;
        uVar21 = (uint5)uVar33;
        auVar49._0_2_ = -(ushort)((ushort)uVar4 == (ushort)(byte)uVar5);
        auVar49._2_2_ = -(ushort)((short)((ulong)uVar4 >> 0x10) == (short)uVar33);
        auVar49._4_2_ = -(ushort)((short)((ulong)uVar4 >> 0x20) == (short)((uint7)uVar18 >> 0x20));
        auVar49._6_2_ = -(ushort)((ushort)((ulong)uVar4 >> 0x30) == (ushort)bVar46);
        auVar49._8_2_ = 0xffff;
        auVar49._10_2_ = 0xffff;
        auVar49._12_2_ = 0xffff;
        auVar49._14_2_ = 0xffff;
        uVar37 = ~(uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7) & 0xff;
        uVar41 = (uint)(ushort)((ushort)(byte)(CONCAT52(uVar21,(ushort)(byte)uVar5) >> 7) |
                                (ushort)(byte)(uVar21 >> 7) << 2 |
                                (ushort)(byte)(uVar21 >> 0x17) << 4 |
                               (ushort)(byte)((byte)(uVar33 >> 0x20) >> 7) << 6);
        lVar35 = lVar34 + 4;
        if (uVar41 == 0 && uVar37 == 0) goto LAB_001248ab;
        uVar41 = uVar41 | uVar37;
        sVar36 = 1;
        goto LAB_00124898;
      }
      auVar48 = *(undefined1 (*) [16])(pbVar42 + lVar34);
      psVar44 = psVar39 + lVar34;
      psVar2 = psVar39 + lVar34 + 8;
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar48._0_13_;
      auVar6[0xe] = auVar48[7];
      auVar8[0xc] = auVar48[6];
      auVar8._0_12_ = auVar48._0_12_;
      auVar8._13_2_ = auVar6._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar48._0_11_;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12[10] = auVar48[5];
      auVar12._0_10_ = auVar48._0_10_;
      auVar12._11_4_ = auVar10._11_4_;
      auVar14[9] = 0;
      auVar14._0_9_ = auVar48._0_9_;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = auVar48[4];
      auVar16._0_8_ = auVar48._0_8_;
      auVar16._9_6_ = auVar14._9_6_;
      auVar22._7_8_ = 0;
      auVar22._0_7_ = auVar16._8_7_;
      Var23 = CONCAT81(SUB158(auVar22 << 0x40,7),auVar48[3]);
      auVar29._9_6_ = 0;
      auVar29._0_9_ = Var23;
      auVar24._1_10_ = SUB1510(auVar29 << 0x30,5);
      auVar24[0] = auVar48[2];
      auVar30._11_4_ = 0;
      auVar30._0_11_ = auVar24;
      auVar25._1_12_ = SUB1512(auVar30 << 0x20,3);
      auVar25[0] = auVar48[1];
      auVar50._0_2_ = -(ushort)((ushort)auVar48[0] == *psVar44);
      auVar50._2_2_ = -(ushort)(auVar25._0_2_ == psVar44[1]);
      auVar50._4_2_ = -(ushort)(auVar24._0_2_ == psVar44[2]);
      auVar50._6_2_ = -(ushort)((storage_type_conflict)Var23 == psVar44[3]);
      auVar50._8_2_ = -(ushort)(auVar16._8_2_ == psVar44[4]);
      auVar50._10_2_ = -(ushort)(auVar12._10_2_ == psVar44[5]);
      auVar50._12_2_ = -(ushort)(auVar8._12_2_ == psVar44[6]);
      auVar50._14_2_ = -(ushort)((storage_type_conflict)(auVar6._13_2_ >> 8) == psVar44[7]);
      auVar47._0_2_ = -(ushort)((ushort)auVar48[8] == *psVar2);
      auVar47._2_2_ = -(ushort)((ushort)auVar48[9] == psVar2[1]);
      auVar47._4_2_ = -(ushort)((ushort)auVar48[10] == psVar2[2]);
      auVar47._6_2_ = -(ushort)((ushort)auVar48[0xb] == psVar2[3]);
      auVar47._8_2_ = -(ushort)((ushort)auVar48[0xc] == psVar2[4]);
      auVar47._10_2_ = -(ushort)((ushort)auVar48[0xd] == psVar2[5]);
      auVar47._12_2_ = -(ushort)((ushort)auVar48[0xe] == psVar2[6]);
      auVar47._14_2_ = -(ushort)((ushort)auVar48[0xf] == psVar2[7]);
      uVar41 = CONCAT22((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                        (ushort)((byte)(auVar47._14_2_ >> 7) & 1) << 0xe | auVar47._14_2_ & 0x8000,
                        (ushort)(SUB161(auVar50 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                        (ushort)((byte)(auVar50._14_2_ >> 7) & 1) << 0xe | auVar50._14_2_ & 0x8000);
      if (uVar41 != 0xffffffff) {
        uVar41 = ~uVar41;
LAB_00124893:
        sVar36 = 1;
        goto LAB_00124898;
      }
      uVar40 = (ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar48[0xf] >> 7) << 0xf;
      lVar35 = lVar34 + 0x10;
    } while (uVar40 == 0);
    uVar41 = (uint)uVar40;
    sVar36 = 0;
LAB_00124898:
    if (uVar41 == 0) {
      uVar37 = 0x20;
    }
    else {
      uVar37 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
    }
    lVar35 = lVar34 + (ulong)(uVar37 >> sVar36);
LAB_001248ab:
    pbVar42 = pbVar42 + lVar35;
    psVar39 = psVar39 + lVar35;
    if ((pbVar42 < pbVar43) && (psVar39 < psVar1)) {
      psVar44 = psVar39 + 1;
      ucs4_00 = (char32_t)(ushort)*psVar39;
      ucs4 = (char32_t)*pbVar42;
      if (((char)*pbVar42 < '\0') &&
         ((ucs4 = L'�', psVar44 < psVar1 && (ucs4_00 & 0xfc00U) == 0xd800 &&
          (sVar45 = *psVar44, ((ushort)sVar45 & 0xfc00) == 0xdc00)))) {
        psVar44 = psVar39 + 2;
        ucs4_00 = (uint)(ushort)*psVar39 * 0x400 + (uint)(ushort)sVar45 + L'\xfca02400';
      }
      if (cs == CaseInsensitive) {
        ucs4 = QChar::toCaseFolded(ucs4);
        ucs4_00 = QChar::toCaseFolded(ucs4_00);
      }
      pbVar42 = pbVar42 + 1;
      psVar39 = psVar44;
      if (ucs4 - ucs4_00 != 0) {
        return ucs4 - ucs4_00;
      }
    }
    if ((pbVar43 <= pbVar42) || (psVar1 <= psVar39)) {
      return (uint)(pbVar42 < pbVar43) - (uint)(psVar39 < psVar1);
    }
  } while( true );
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QStringView utf16, Qt::CaseSensitivity cs) noexcept
{
    auto src1 = reinterpret_cast<const qchar8_t *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const char16_t *>(utf16.data());
    auto end2 = src2 + utf16.size();

    do {
        simdCompareAscii(src1, end1, src2, end2);

        if (src1 < end1 && src2 < end2) {
            char32_t uc1 = *src1++;
            char32_t uc2 = *src2++;

            if (uc1 >= 0x80) {
                char32_t *output = &uc1;
                qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraitsNoAscii>(uc1, output, src1, end1);
                if (res < 0) {
                    // decoding error
                    uc1 = QChar::ReplacementCharacter;
                }

                // Only decode the UTF-16 surrogate pair if the UTF-8 code point
                // wasn't US-ASCII (a surrogate cannot match US-ASCII).
                if (QChar::isHighSurrogate(uc2) && src2 < end2 && QChar::isLowSurrogate(*src2))
                    uc2 = QChar::surrogateToUcs4(uc2, *src2++);
            }
            if (cs == Qt::CaseInsensitive) {
                uc1 = QChar::toCaseFolded(uc1);
                uc2 = QChar::toCaseFolded(uc2);
            }
            if (uc1 != uc2)
                return int(uc1) - int(uc2);
        }
    } while (src1 < end1 && src2 < end2);

    // the shorter string sorts first
    return (end1 > src1) - int(end2 > src2);
}